

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRailing::~IfcRailing(IfcRailing *this)

{
  *(undefined8 *)&this[-1].field_0x50 = 0x940be8;
  *(undefined8 *)&this->field_0x38 = 0x940d00;
  *(undefined8 *)&this[-1].field_0xd8 = 0x940c10;
  *(undefined8 *)&this[-1].field_0xe8 = 0x940c38;
  *(undefined8 *)&this[-1].field_0x120 = 0x940c60;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x940c88;
  *(undefined8 *)&this[-1].field_0x188 = 0x940cb0;
  *(undefined8 *)this = 0x940cd8;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x50,&PTR_construction_vtable_24__00940d20);
  operator_delete(&this[-1].field_0x50,0x198);
  return;
}

Assistant:

IfcRailing() : Object("IfcRailing") {}